

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int LSetup(int jbad,int *jcur,void *mem)

{
  long in_RDX;
  undefined4 *in_RSI;
  IntegratorMem Imem;
  int retval;
  int local_4;
  
  if (in_RDX == 0) {
    printf("ERROR: Integrator memory is NULL");
    local_4 = -1;
  }
  else {
    local_4 = Jac(0.0,*(N_Vector *)(in_RDX + 8),(N_Vector)0x0,*(SUNMatrix *)(in_RDX + 0x28),
                  (void *)0x0,(N_Vector)0x0,(N_Vector)0x0,(N_Vector)0x0);
    if (local_4 == 0) {
      *in_RSI = 1;
      local_4 = SUNLinSolSetup(*(undefined8 *)(in_RDX + 0x30),*(undefined8 *)(in_RDX + 0x28));
    }
  }
  return local_4;
}

Assistant:

int LSetup(sunbooleantype jbad, sunbooleantype* jcur, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  /* compute the Jacobian */
  retval = Jac(ZERO, Imem->ycur, NULL, Imem->A, NULL, NULL, NULL, NULL);
  if (retval != 0) { return (retval); }

  /* update Jacobian status */
  *jcur = SUNTRUE;

  /* setup the linear solver */
  retval = SUNLinSolSetup(Imem->LS, Imem->A);

  return (retval);
}